

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

cf_bool_t cf_array_reserve(cf_array_t *self,int count)

{
  bool bVar1;
  int local_1c;
  int count_local;
  cf_array_t *self_local;
  
  local_1c = count;
  if (count < 0) {
    local_1c = (int)self->capacity;
  }
  bVar1 = local_1c <= (int)self->capacity;
  if (bVar1) {
    self->elm_count = (long)local_1c;
    cf_membzero(self->elm_start,self->elm_size * (long)local_1c);
  }
  self_local._4_4_ = (uint)bVar1;
  return self_local._4_4_;
}

Assistant:

cf_bool_t cf_array_reserve(cf_array_t* self, int count) {
    if (count < 0) {
        count = self->capacity;
    }
    if (count > (int)self->capacity) {
        return CF_FALSE;
    }
    self->elm_count = count;
    cf_membzero(self->elm_start, self->elm_size * count);
    return CF_TRUE;
}